

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  int iVar5;
  code *pcVar6;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int (*paiVar11) [64];
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar1 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       ((cinfo->Se < 0x40 && (cinfo->Se != cinfo->lim_Se)))) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7d;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar6 = decode_mcu;
    goto LAB_001129aa;
  }
  iVar5 = cinfo->Se;
  if (iVar1 == 0) {
    if (iVar5 == 0) goto LAB_00112837;
LAB_00112858:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x11;
    (pjVar3->msg_parm).i[0] = iVar1;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if (((iVar5 < iVar1) || (cinfo->lim_Se < iVar5)) || (cinfo->comps_in_scan != 1))
    goto LAB_00112858;
LAB_00112837:
    if (cinfo->Ah == 0) {
      iVar5 = cinfo->Al;
    }
    else {
      iVar5 = cinfo->Ah + -1;
      if (iVar5 != cinfo->Al) goto LAB_00112858;
    }
    if (0xd < iVar5) goto LAB_00112858;
  }
  for (lVar8 = 0; lVar8 < cinfo->comps_in_scan; lVar8 = lVar8 + 1) {
    iVar1 = cinfo->cur_comp_info[lVar8]->component_index;
    paiVar11 = cinfo->coef_bits + iVar1;
    iVar5 = cinfo->Ss;
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else if ((*paiVar11)[0] < 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x76;
      (pjVar3->msg_parm).i[0] = iVar1;
      (cinfo->err->msg_parm).i[1] = 0;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      iVar5 = cinfo->Ss;
    }
    for (lVar10 = (long)iVar5; lVar10 <= cinfo->Se; lVar10 = lVar10 + 1) {
      iVar5 = (*paiVar11)[lVar10];
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (cinfo->Ah != iVar5) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x76;
        (pjVar3->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = (int)lVar10;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      (*paiVar11)[lVar10] = cinfo->Al;
    }
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar6 = decode_mcu_DC_first;
    }
    else {
      pcVar6 = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar6 = decode_mcu_DC_refine;
  }
  else {
    pcVar6 = decode_mcu_AC_refine;
  }
LAB_001129aa:
  pjVar2->decode_mcu = pcVar6;
  lVar8 = 0;
  do {
    if (cinfo->comps_in_scan <= lVar8) {
      pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
      pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
      *(undefined4 *)&pjVar2[2].start_pass = 0xfffffff0;
      *(uint *)((long)&pjVar2[4].start_pass + 4) = cinfo->restart_interval;
      return;
    }
    pjVar4 = cinfo->cur_comp_info[lVar8];
    if (cinfo->progressive_mode == 0) {
LAB_001129ef:
      iVar1 = pjVar4->dc_tbl_no;
      uVar9 = (ulong)iVar1;
      if (0xf < uVar9) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x32;
        (pjVar3->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      p_Var7 = (&pjVar2[4].decode_mcu)[uVar9];
      if (p_Var7 == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
        p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
        (&pjVar2[4].decode_mcu)[uVar9] = p_Var7;
      }
      *(undefined8 *)(p_Var7 + 0x30) = 0;
      *(undefined8 *)(p_Var7 + 0x38) = 0;
      *(undefined8 *)(p_Var7 + 0x20) = 0;
      *(undefined8 *)(p_Var7 + 0x28) = 0;
      *(undefined8 *)(p_Var7 + 0x10) = 0;
      *(undefined8 *)(p_Var7 + 0x18) = 0;
      *(undefined8 *)p_Var7 = 0;
      *(undefined8 *)(p_Var7 + 8) = 0;
      *(undefined4 *)((long)&pjVar2[2].start_pass + lVar8 * 4 + 4) = 0;
      *(undefined4 *)((long)&pjVar2[3].start_pass + lVar8 * 4 + 4) = 0;
      if (cinfo->progressive_mode == 0) {
        iVar1 = cinfo->lim_Se;
      }
      else {
        iVar1 = cinfo->Ss;
      }
      if (iVar1 != 0) {
LAB_00112a67:
        iVar1 = pjVar4->ac_tbl_no;
        uVar9 = (ulong)iVar1;
        if (0xf < uVar9) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x32;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        p_Var7 = (&pjVar2[0xc].decode_mcu)[uVar9];
        if (p_Var7 == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
          p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          (&pjVar2[0xc].decode_mcu)[uVar9] = p_Var7;
        }
        memset(p_Var7,0,0x100);
      }
    }
    else {
      if (cinfo->Ss != 0) goto LAB_00112a67;
      if (cinfo->Ah == 0) goto LAB_001129ef;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass (j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
	/* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
	cinfo->arith_ac_K[tbl] = cinfo->Ss + ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}